

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O0

int emulator_disassemble(Emulator *e,Address addr,char *buffer,size_t size)

{
  int local_c0;
  char local_bb [3];
  int local_b8;
  u8 local_b4;
  char bank [3];
  int num_bytes;
  u8 data [3];
  char hex [3] [3];
  char instr [120];
  size_t size_local;
  char *buffer_local;
  Address addr_local;
  Emulator *e_local;
  
  stack0xffffffffffffff4f = 0x2020002020002020;
  hex[0][0] = '\0';
  local_b4 = read_u8_raw(e,addr);
  bank[0] = read_u8_raw(e,addr + 1);
  bank[1] = read_u8_raw(e,addr + 2);
  local_b8 = disassemble_instr(&local_b4,hex[0] + 1,0x78);
  local_bb[0] = '?';
  local_bb[1] = '?';
  local_bb[2] = 0;
  if (addr < 0x4000) {
    sprint_hex(local_bb,(u8)((e->state).memory_map_state.rom_base[0] >> 0xe));
  }
  else if (addr < 0x8000) {
    sprint_hex(local_bb,(u8)((e->state).memory_map_state.rom_base[1] >> 0xe));
  }
  snprintf(buffer,size,"[%s]%#06x: %s",local_bb,(ulong)addr,hex[0] + 1);
  if (local_b8 == 0) {
    local_c0 = 1;
  }
  else {
    local_c0 = local_b8;
  }
  return local_c0;
}

Assistant:

int emulator_disassemble(Emulator* e, Address addr, char* buffer, size_t size) {
  char instr[120];
  char hex[][3] = {"  ", "  ", "  "};

  u8 data[3] = {read_u8_raw(e, addr), read_u8_raw(e, addr + 1),
                read_u8_raw(e, addr + 2)};
  int num_bytes = disassemble_instr(data, instr, sizeof(instr));

  char bank[3] = "??";
  if (addr < 0x4000) {
    sprint_hex(bank, e->state.memory_map_state.rom_base[0] >> ROM_BANK_SHIFT);
  } else if (addr < 0x8000) {
    sprint_hex(bank, e->state.memory_map_state.rom_base[1] >> ROM_BANK_SHIFT);
  }

  snprintf(buffer, size, "[%s]%#06x: %s", bank, addr, instr);
  return num_bytes ? num_bytes : 1;
}